

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_tuple.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_2bd0f2::kamikaze::kamikaze(kamikaze *this,kamikaze *param_1)

{
  runtime_error *this_00;
  undefined5 *local_40;
  undefined8 local_38;
  undefined5 local_30;
  undefined3 uStack_2b;
  undefined5 uStack_28;
  undefined1 local_23;
  
  if ((anonymous_namespace)::kamikaze::instances_count < 5) {
    (anonymous_namespace)::kamikaze::instances_count =
         (anonymous_namespace)::kamikaze::instances_count + 1;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_40 = &local_30;
  local_30 = 0xd080d19fd0;
  uStack_2b = 0xb2d0b8;
  uStack_28 = 0x2182d1b5d0;
  local_38 = 0xd;
  local_23 = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_40);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

kamikaze (kamikaze &&)
        {
            if (instances_count > 4)
            {
                throw std::runtime_error(u8"Привет!"_u8s);
            }
            ++instances_count;
        }